

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhostinfo.cpp
# Opt level: O0

QHostInfo QHostInfoAgent::lookup(QString *hostName)

{
  sockaddr *psVar1;
  bool bVar2;
  char *pcVar3;
  QByteArrayView *in_RSI;
  QHostInfoPrivate *in_RDI;
  long in_FS_OFFSET;
  sockaddr_in6 *sa6;
  addrinfo *node;
  int result;
  QHostInfo *results;
  QHostAddress addr_1;
  QHostAddress addr;
  QList<QHostAddress> addresses;
  addrinfo hints;
  addrinfo *res;
  QByteArray aceHostname;
  undefined4 in_stack_fffffffffffffe78;
  HostInfoError in_stack_fffffffffffffe7c;
  undefined4 in_stack_fffffffffffffe80;
  int iVar4;
  int in_stack_fffffffffffffe84;
  QHostInfo *in_stack_fffffffffffffe90;
  addrinfo *local_158;
  int local_14c;
  undefined1 local_118 [24];
  char local_100 [24];
  char local_e8 [24];
  char local_d0 [24];
  undefined1 local_b8 [24];
  undefined8 local_a0;
  undefined8 local_98;
  undefined8 local_90;
  undefined8 local_88;
  undefined8 local_80;
  addrinfo local_78;
  addrinfo *local_48;
  char local_40 [28];
  undefined1 local_24 [4];
  undefined8 local_20;
  undefined8 local_18;
  undefined8 local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  *(undefined8 *)in_RDI = 0xaaaaaaaaaaaaaaaa;
  QHostInfo::QHostInfo(in_stack_fffffffffffffe90,(int)((ulong)in_RDI >> 0x20));
  local_20 = 0xaaaaaaaaaaaaaaaa;
  local_18 = 0xaaaaaaaaaaaaaaaa;
  local_10 = 0xaaaaaaaaaaaaaaaa;
  memset(local_24,0,4);
  QFlags<QUrl::AceProcessingOption>::QFlags((QFlags<QUrl::AceProcessingOption> *)0x21cf14);
  QUrl::toAce((QString *)&local_20,(QFlags_conflict *)in_RSI);
  QHostInfo::setHostName
            ((QHostInfo *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
             (QString *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
  bVar2 = QByteArray::isEmpty((QByteArray *)0x21cf49);
  if (bVar2) {
    QHostInfo::setError((QHostInfo *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                        in_stack_fffffffffffffe7c);
    bVar2 = QString::isEmpty((QString *)0x21cf6b);
    if (bVar2) {
      QCoreApplication::translate(local_40,"QHostInfoAgent","No host name given",0);
    }
    else {
      QCoreApplication::translate(local_40,"QHostInfoAgent","Invalid hostname",0);
    }
    QHostInfo::setErrorString
              ((QHostInfo *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
               (QString *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
    QString::~QString((QString *)0x21cfdc);
  }
  else {
    local_48 = (addrinfo *)0x0;
    memset(&local_78,0xaa,0x30);
    memset(&local_78,0,0x30);
    local_78.ai_family = 0;
    local_78.ai_flags = 0x20;
    pcVar3 = QByteArray::constData((QByteArray *)0x21d048);
    local_14c = getaddrinfo(pcVar3,(char *)0x0,&local_78,&local_48);
    if (local_14c == -1) {
      local_78.ai_flags = 0;
      pcVar3 = QByteArray::constData((QByteArray *)0x21d087);
      local_14c = getaddrinfo(pcVar3,(char *)0x0,&local_78,&local_48);
    }
    if (local_14c == 0) {
      local_158 = local_48;
      local_90 = 0xaaaaaaaaaaaaaaaa;
      local_88 = 0xaaaaaaaaaaaaaaaa;
      local_80 = 0xaaaaaaaaaaaaaaaa;
      QList<QHostAddress>::QList((QList<QHostAddress> *)0x21d0f9);
      for (; local_158 != (addrinfo *)0x0; local_158 = local_158->ai_next) {
        in_stack_fffffffffffffe84 = local_158->ai_family;
        if (in_stack_fffffffffffffe84 == 2) {
          local_98 = 0xaaaaaaaaaaaaaaaa;
          QHostAddress::QHostAddress((QHostAddress *)CONCAT44(2,in_stack_fffffffffffffe80));
          ntohl(*(uint32_t *)(local_158->ai_addr->sa_data + 2));
          QHostAddress::setAddress
                    ((QHostAddress *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                     in_stack_fffffffffffffe7c);
          bVar2 = QListSpecialMethodsBase<QHostAddress>::contains<QHostAddress>
                            ((QListSpecialMethodsBase<QHostAddress> *)
                             CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                             (QHostAddress *)
                             CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
          if (!bVar2) {
            QList<QHostAddress>::append
                      ((QList<QHostAddress> *)
                       CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                       (parameter_type)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78)
                      );
          }
          QHostAddress::~QHostAddress((QHostAddress *)0x21d1a9);
        }
        else if (in_stack_fffffffffffffe84 == 10) {
          local_a0 = 0xaaaaaaaaaaaaaaaa;
          QHostAddress::QHostAddress((QHostAddress *)CONCAT44(10,in_stack_fffffffffffffe80));
          psVar1 = local_158->ai_addr;
          QHostAddress::setAddress
                    ((QHostAddress *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                     (quint8 *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
          if (*(int *)(psVar1[1].sa_data + 6) != 0) {
            QString::number((uint)local_b8,*(int *)(psVar1[1].sa_data + 6));
            QHostAddress::setScopeId((QHostAddress *)in_RSI,(QString *)in_RDI);
            QString::~QString((QString *)0x21d235);
          }
          bVar2 = QListSpecialMethodsBase<QHostAddress>::contains<QHostAddress>
                            ((QListSpecialMethodsBase<QHostAddress> *)
                             CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                             (QHostAddress *)
                             CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
          if (!bVar2) {
            QList<QHostAddress>::append
                      ((QList<QHostAddress> *)
                       CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                       (parameter_type)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78)
                      );
          }
          QHostAddress::~QHostAddress((QHostAddress *)0x21d278);
        }
        else {
          QHostInfo::setError((QHostInfo *)
                              CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                              in_stack_fffffffffffffe7c);
          QCoreApplication::translate(local_d0,"QHostInfoAgent","Unknown address type",0);
          QHostInfo::setErrorString
                    ((QHostInfo *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                     (QString *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
          QString::~QString((QString *)0x21d2cd);
        }
      }
      bVar2 = QList<QHostAddress>::isEmpty((QList<QHostAddress> *)0x21d2ed);
      if (bVar2) {
        QHostInfo::setError((QHostInfo *)
                            CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                            in_stack_fffffffffffffe7c);
        QCoreApplication::translate(local_e8,"QHostInfoAgent","Unknown address type",0);
        QHostInfo::setErrorString
                  ((QHostInfo *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                   (QString *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
        QString::~QString((QString *)0x21d346);
      }
      QHostInfo::setAddresses
                ((QHostInfo *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                 (QList<QHostAddress> *)
                 CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
      freeaddrinfo(local_48);
      QList<QHostAddress>::~QList((QList<QHostAddress> *)0x21d372);
    }
    else if ((local_14c + 5U < 2) || (local_14c == -2)) {
      QHostInfo::setError((QHostInfo *)CONCAT44(in_stack_fffffffffffffe84,local_14c),
                          in_stack_fffffffffffffe7c);
      QCoreApplication::translate(local_100,"QHostInfoAgent","Host not found",0);
      QHostInfo::setErrorString
                ((QHostInfo *)CONCAT44(in_stack_fffffffffffffe84,local_14c),
                 (QString *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
      QString::~QString((QString *)0x21d3e7);
    }
    else {
      iVar4 = local_14c;
      QHostInfo::setError((QHostInfo *)CONCAT44(in_stack_fffffffffffffe84,local_14c),
                          in_stack_fffffffffffffe7c);
      gai_strerror(local_14c);
      QByteArrayView::QByteArrayView<const_char_*,_true>(in_RSI,(char **)in_RDI);
      QString::fromLocal8Bit((QByteArrayView *)local_118);
      QHostInfo::setErrorString
                ((QHostInfo *)CONCAT44(in_stack_fffffffffffffe84,iVar4),
                 (QString *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
      QString::~QString((QString *)0x21d442);
    }
  }
  QByteArray::~QByteArray((QByteArray *)0x21d45e);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (QHostInfo)in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QHostInfo QHostInfoAgent::lookup(const QString &hostName)
{
    QHostInfo results;

    // IDN support
    QByteArray aceHostname = QUrl::toAce(hostName);
    results.setHostName(hostName);
    if (aceHostname.isEmpty()) {
        results.setError(QHostInfo::HostNotFound);
        results.setErrorString(hostName.isEmpty() ?
                               QCoreApplication::translate("QHostInfoAgent", "No host name given") :
                               QCoreApplication::translate("QHostInfoAgent", "Invalid hostname"));
        return results;
    }

    addrinfo *res = nullptr;
    struct addrinfo hints;
    memset(&hints, 0, sizeof(hints));
    hints.ai_family = PF_UNSPEC;
#ifdef Q_ADDRCONFIG
    hints.ai_flags = Q_ADDRCONFIG;
#endif

    int result = getaddrinfo(aceHostname.constData(), nullptr, &hints, &res);
# ifdef Q_ADDRCONFIG
    if (result == EAI_BADFLAGS) {
        // if the lookup failed with AI_ADDRCONFIG set, try again without it
        hints.ai_flags = 0;
        result = getaddrinfo(aceHostname.constData(), nullptr, &hints, &res);
    }
# endif

    if (result == 0) {
        addrinfo *node = res;
        QList<QHostAddress> addresses;
        while (node) {
#ifdef QHOSTINFO_DEBUG
            qDebug() << "getaddrinfo node: flags:" << node->ai_flags << "family:" << node->ai_family
                     << "ai_socktype:" << node->ai_socktype << "ai_protocol:" << node->ai_protocol
                     << "ai_addrlen:" << node->ai_addrlen;
#endif
            switch (node->ai_family) {
            case AF_INET: {
                QHostAddress addr;
                addr.setAddress(ntohl(((sockaddr_in *) node->ai_addr)->sin_addr.s_addr));
                if (!addresses.contains(addr))
                    addresses.append(addr);
                break;
            }
            case AF_INET6: {
                QHostAddress addr;
                sockaddr_in6 *sa6 = (sockaddr_in6 *) node->ai_addr;
                addr.setAddress(sa6->sin6_addr.s6_addr);
                if (sa6->sin6_scope_id)
                    addr.setScopeId(QString::number(sa6->sin6_scope_id));
                if (!addresses.contains(addr))
                    addresses.append(addr);
                break;
            }
            default:
                results.setError(QHostInfo::UnknownError);
                results.setErrorString(QCoreApplication::translate("QHostInfoAgent", "Unknown address type"));
            }
            node = node->ai_next;
        }
        if (addresses.isEmpty()) {
            // Reached the end of the list, but no addresses were found; this
            // means the list contains one or more unknown address types.
            results.setError(QHostInfo::UnknownError);
            results.setErrorString(QCoreApplication::translate("QHostInfoAgent", "Unknown address type"));
        }

        results.setAddresses(addresses);
        freeaddrinfo(res);
    } else {
        switch (result) {
#ifdef Q_OS_WIN
        case WSAHOST_NOT_FOUND: //authoritative not found
        case WSATRY_AGAIN: //non authoritative not found
        case WSANO_DATA: //valid name, no associated address
#else
        case EAI_NONAME:
        case EAI_FAIL:
#  ifdef EAI_NODATA // EAI_NODATA is deprecated in RFC 3493
        case EAI_NODATA:
#  endif
#endif
            results.setError(QHostInfo::HostNotFound);
            results.setErrorString(QCoreApplication::translate("QHostInfoAgent", "Host not found"));
            break;
        default:
            results.setError(QHostInfo::UnknownError);
#ifdef Q_OS_WIN
            results.setErrorString(QString::fromWCharArray(gai_strerror(result)));
#else
            results.setErrorString(QString::fromLocal8Bit(gai_strerror(result)));
#endif
            break;
        }
    }

#if defined(QHOSTINFO_DEBUG)
    if (results.error() != QHostInfo::NoError) {
        qDebug("QHostInfoAgent::fromName(): error #%d %s",
               h_errno, results.errorString().toLatin1().constData());
    } else {
        QString tmp;
        QList<QHostAddress> addresses = results.addresses();
        for (int i = 0; i < addresses.count(); ++i) {
            if (i != 0) tmp += ", "_L1;
            tmp += addresses.at(i).toString();
        }
        qDebug("QHostInfoAgent::fromName(): found %i entries for \"%s\": {%s}",
               addresses.count(), aceHostname.constData(),
               tmp.toLatin1().constData());
    }
#endif

    return results;
}